

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_schnorrsig_sign_custom
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_schnorrsig_extraparams *extraparams)

{
  secp256k1_fe *r;
  int iVar1;
  int extraout_EAX;
  secp256k1_gej *r_00;
  uchar *msg_00;
  uchar *data;
  secp256k1_gej *data_00;
  long lVar2;
  void *ndata;
  secp256k1_fe *r_01;
  secp256k1_scalar *data_01;
  secp256k1_nonce_function_hardened noncefp;
  uchar auStackY_c18 [32];
  secp256k1_sha256 sStackY_bf8;
  secp256k1_fe *psStackY_b88;
  uchar *puStackY_b80;
  secp256k1_scalar *psStackY_b78;
  secp256k1_gej *psStackY_b70;
  code *pcStackY_b68;
  int iStackY_b5c;
  secp256k1_fe sStackY_b58;
  secp256k1_scalar sStackY_b28;
  secp256k1_strauss_state sStackY_b08;
  uchar auStackY_af0 [40];
  secp256k1_scalar sStackY_ac8;
  secp256k1_ge sStackY_aa8;
  secp256k1_gej sStackY_a40;
  secp256k1_gej sStackY_9a8;
  undefined1 auStackY_910 [92];
  int iStackY_8b4;
  int iStackY_8b0;
  secp256k1_fe asStackY_500 [8];
  secp256k1_ge asStackY_380 [8];
  
  if (ctx != (secp256k1_context *)0x0) {
    if (extraparams == (secp256k1_schnorrsig_extraparams *)0x0) {
      noncefp = (secp256k1_nonce_function_hardened)0x0;
      ndata = (void *)0x0;
    }
    else {
      lVar2 = 0;
      do {
        if (extraparams->magic[lVar2] != schnorrsig_extraparams_magic[lVar2]) {
          (*(ctx->illegal_callback).fn)
                    ("secp256k1_memcmp_var(extraparams->magic, schnorrsig_extraparams_magic, sizeof(extraparams->magic)) == 0"
                     ,(ctx->illegal_callback).data);
          return 0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      noncefp = extraparams->noncefp;
      ndata = extraparams->ndata;
    }
    iVar1 = secp256k1_schnorrsig_sign_internal(ctx,sig64,msg,msglen,keypair,noncefp,ndata);
    return iVar1;
  }
  secp256k1_schnorrsig_sign_custom_cold_1();
  if (ctx == (secp256k1_context *)0x0) {
    pcStackY_b68 = (code *)0x120330;
    secp256k1_schnorrsig_verify_cold_5();
  }
  else if (sig64 != (uchar *)0x0) {
    if (msglen != 0 && msg_00 == (uchar *)0x0) {
      pcStackY_b68 = (code *)0x120345;
      secp256k1_schnorrsig_verify_cold_3();
      return 0;
    }
    if (keypair == (secp256k1_keypair *)0x0) {
      pcStackY_b68 = (code *)0x120352;
      secp256k1_schnorrsig_verify_cold_2();
      return 0;
    }
    pcStackY_b68 = (code *)0x120185;
    secp256k1_fe_impl_set_b32_mod(&sStackY_b58,sig64);
    if (((0xffffefffffc2e < sStackY_b58.n[0]) && (sStackY_b58.n[4] == 0xffffffffffff)) &&
       ((sStackY_b58.n[2] & sStackY_b58.n[3] & sStackY_b58.n[1]) == 0xfffffffffffff)) {
      return 0;
    }
    sStackY_b58.magnitude = 1;
    sStackY_b58.normalized = 1;
    pcStackY_b68 = (code *)0x1201dd;
    secp256k1_fe_verify(&sStackY_b58);
    pcStackY_b68 = (code *)0x1201f4;
    secp256k1_scalar_set_b32(&sStackY_b28,sig64 + 0x20,&iStackY_b5c);
    if (iStackY_b5c != 0) {
      return 0;
    }
    pcStackY_b68 = (code *)0x120220;
    iVar1 = secp256k1_pubkey_load(ctx,&sStackY_aa8,(secp256k1_pubkey *)keypair);
    if (iVar1 == 0) {
      return 0;
    }
    pcStackY_b68 = (code *)0x12023c;
    secp256k1_fe_get_b32(auStackY_af0,&sStackY_aa8.x);
    pcStackY_b68 = (code *)0x120258;
    secp256k1_schnorrsig_challenge(&sStackY_ac8,sig64,msg_00,msglen,auStackY_af0);
    pcStackY_b68 = (code *)0x120263;
    secp256k1_scalar_negate(&sStackY_ac8,&sStackY_ac8);
    r_00 = &sStackY_a40;
    pcStackY_b68 = (code *)0x120276;
    secp256k1_gej_set_ge(r_00,&sStackY_aa8);
    sStackY_b08.aux = asStackY_500;
    sStackY_b08.pre_a = asStackY_380;
    sStackY_b08.ps = (secp256k1_strauss_point_state *)auStackY_910;
    pcStackY_b68 = (code *)0x1202be;
    data_01 = &sStackY_ac8;
    secp256k1_ecmult_strauss_wnaf(&sStackY_b08,&sStackY_9a8,1,r_00,&sStackY_ac8,&sStackY_b28);
    pcStackY_b68 = (code *)0x1202d1;
    data_00 = &sStackY_9a8;
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStackY_910,&sStackY_9a8);
    pcStackY_b68 = (code *)0x1202d9;
    secp256k1_ge_verify((secp256k1_ge *)auStackY_910);
    if (iStackY_8b0 != 0) {
      return 0;
    }
    r = (secp256k1_fe *)(auStackY_910 + 0x30);
    pcStackY_b68 = (code *)0x1202f3;
    secp256k1_fe_normalize_var(r);
    pcStackY_b68 = (code *)0x1202fb;
    r_01 = r;
    secp256k1_fe_verify(r);
    if (iStackY_8b4 != 0) {
      if ((auStackY_910[0x30] & 1) == 0) {
        pcStackY_b68 = (code *)0x120326;
        iVar1 = secp256k1_fe_equal(&sStackY_b58,(secp256k1_fe *)auStackY_910);
        return iVar1;
      }
      return 0;
    }
    pcStackY_b68 = secp256k1_schnorrsig_challenge;
    secp256k1_schnorrsig_verify_cold_1();
    sStackY_bf8.s[0] = 0x9cecba11;
    sStackY_bf8.s[1] = 0x23925381;
    sStackY_bf8.s[2] = 0x11679112;
    sStackY_bf8.s[3] = 0xd1627e0f;
    sStackY_bf8.s[4] = 0x97c87550;
    sStackY_bf8.s[5] = 0x3cc765;
    sStackY_bf8.s[6] = 0x90f61164;
    sStackY_bf8.s[7] = 0x33e9b66a;
    sStackY_bf8.bytes = 0x40;
    psStackY_b88 = r;
    puStackY_b80 = sig64;
    psStackY_b78 = &sStackY_ac8;
    psStackY_b70 = &sStackY_9a8;
    secp256k1_sha256_write(&sStackY_bf8,(uchar *)data_00,0x20);
    secp256k1_sha256_write(&sStackY_bf8,(uchar *)data_01,0x20);
    secp256k1_sha256_write(&sStackY_bf8,data,(size_t)r_00);
    secp256k1_sha256_finalize(&sStackY_bf8,auStackY_c18);
    secp256k1_scalar_set_b32((secp256k1_scalar *)r_01,auStackY_c18,(int *)0x0);
    return extraout_EAX;
  }
  pcStackY_b68 = (code *)0x120338;
  secp256k1_schnorrsig_verify_cold_4();
  return 0;
}

Assistant:

int secp256k1_schnorrsig_sign_custom(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_schnorrsig_extraparams *extraparams) {
    secp256k1_nonce_function_hardened noncefp = NULL;
    void *ndata = NULL;
    VERIFY_CHECK(ctx != NULL);

    if (extraparams != NULL) {
        ARG_CHECK(secp256k1_memcmp_var(extraparams->magic,
                                       schnorrsig_extraparams_magic,
                                       sizeof(extraparams->magic)) == 0);
        noncefp = extraparams->noncefp;
        ndata = extraparams->ndata;
    }
    return secp256k1_schnorrsig_sign_internal(ctx, sig64, msg, msglen, keypair, noncefp, ndata);
}